

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

ModBroadcastableLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_modbroadcastable(NeuralNetworkLayer *this)

{
  bool bVar1;
  ModBroadcastableLayerParams *this_00;
  NeuralNetworkLayer *this_local;
  
  bVar1 = has_modbroadcastable(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_modbroadcastable(this);
    this_00 = (ModBroadcastableLayerParams *)operator_new(0x18);
    ModBroadcastableLayerParams::ModBroadcastableLayerParams(this_00);
    (this->layer_).modbroadcastable_ = this_00;
  }
  return (ModBroadcastableLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::ModBroadcastableLayerParams* NeuralNetworkLayer::mutable_modbroadcastable() {
  if (!has_modbroadcastable()) {
    clear_layer();
    set_has_modbroadcastable();
    layer_.modbroadcastable_ = new ::CoreML::Specification::ModBroadcastableLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.modBroadcastable)
  return layer_.modbroadcastable_;
}